

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleQuadrature.hpp
# Opt level: O0

RectMatrix<double,_3U,_3U> *
OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,_3U,_3U>,_double>::Integrate
          (function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *f,
          TriangleQuadratureRule *rule,double *area)

{
  size_type sVar1;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  int i;
  RectMatrix<double,_3U,_3U> integral;
  vector<double,_std::allocator<double>_> *weights;
  vector<OpenMD::Vector2<double>,_std::allocator<OpenMD::Vector2<double>_>_>
  *barycentric_coordinates;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *m;
  undefined4 in_stack_fffffffffffffe70;
  int iVar2;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *this;
  RectMatrix<double,_3U,_3U> local_160;
  RectMatrix<double,_3U,_3U> local_118;
  int local_d0;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  vector<double,_std::allocator<double>_> *local_30;
  vector<OpenMD::Vector2<double>,_std::allocator<OpenMD::Vector2<double>_>_> *local_28;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *local_10;
  
  local_10 = in_RSI;
  local_28 = TriangleQuadratureRule::quadrature_points((TriangleQuadratureRule *)0x1ef291);
  local_30 = TriangleQuadratureRule::weights((TriangleQuadratureRule *)0x1ef2a6);
  this = local_10;
  std::vector<OpenMD::Vector2<double>,_std::allocator<OpenMD::Vector2<double>_>_>::operator[]
            (local_28,0);
  std::function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>::operator()
            (this,(Vector<double,_2U> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::operator[](local_30,0);
  OpenMD::operator*((RectMatrix<double,_3U,_3U> *)this,(double)in_RDI);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_c0);
  local_d0 = 1;
  while( true ) {
    iVar2 = local_d0;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_30);
    if ((int)sVar1 <= iVar2) break;
    m = local_10;
    std::vector<OpenMD::Vector2<double>,_std::allocator<OpenMD::Vector2<double>_>_>::operator[]
              (local_28,(long)local_d0);
    std::function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>::
    operator()(this,(Vector<double,_2U> *)in_RDI);
    std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_d0);
    OpenMD::operator*((RectMatrix<double,_3U,_3U> *)this,(double)in_RDI);
    RectMatrix<double,_3U,_3U>::operator+=
              ((RectMatrix<double,_3U,_3U> *)CONCAT44(iVar2,in_stack_fffffffffffffe70),
               (RectMatrix<double,_3U,_3U> *)m);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_118);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_160);
    local_d0 = local_d0 + 1;
  }
  OpenMD::operator*((RectMatrix<double,_3U,_3U> *)this,(double)in_RDI);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_78);
  return in_RDI;
}

Assistant:

NumericReturnType TriangleQuadrature<NumericReturnType, T>::Integrate(
      const std::function<NumericReturnType(const Vector<T, 2>&)>& f,
      const TriangleQuadratureRule& rule, const T& area) {
    // Get the quadrature points and weights.
    const std::vector<Vector2<T>>& barycentric_coordinates =
        rule.quadrature_points();
    const std::vector<T>& weights = rule.weights();
    assert(barycentric_coordinates.size() == weights.size());
    assert(weights.size() >= 1);

    // Sum the weighted function evaluated at the transformed
    // quadrature points.  The looping is done in this particular way
    // so that the return type can be either a traditional scalar
    // (e.g., `double`), a Vector, or some other numeric type,
    // without having to worry about the numerous possible ways to
    // initialize to zero (e.g., `double integral = 0.0` vs.
    // VectorXd = VectorXd:zZero())` or having to know
    // the dimension of the NumericReturnType (i.e., scalar or vector
    // dimension).
    NumericReturnType integral = f(barycentric_coordinates[0]) * weights[0];
    for (int i = 1; i < static_cast<int>(weights.size()); ++i)
      integral += f(barycentric_coordinates[i]) * weights[i];

    return integral * area;
  }